

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O2

JavascriptString * __thiscall
Js::CustomExternalWrapperObject::GetEnumerator::WrapperOwnKeysEnumerator::MoveAndGetNext
          (WrapperOwnKeysEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  uint uVar1;
  JavascriptArray *pJVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  undefined4 extraout_var;
  JavascriptString *pJVar6;
  char16 *ptr;
  Var pvVar7;
  undefined1 local_78 [8];
  PropertyDescriptor desc;
  CharacterBuffer<char16_t> propertyString;
  
  *propertyId = -1;
  if (attributes != (PropertyAttributes *)0x0) {
    *attributes = '\x01';
  }
  pJVar2 = (this->trapResult).ptr;
  if (pJVar2 == (JavascriptArray *)0x0) {
LAB_00a11afd:
    pJVar6 = (JavascriptString *)0x0;
  }
  else {
    uVar1 = (pJVar2->super_ArrayObject).length;
    do {
      do {
        do {
          if (uVar1 <= this->index) goto LAB_00a11afd;
          pJVar2 = (this->trapResult).ptr;
          this->index = this->index + 1;
          iVar4 = (*(pJVar2->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x72])();
          pvVar7 = (Var)CONCAT44(extraout_var,iVar4);
        } while ((pvVar7 == (Var)0x0) || (bVar3 = VarIs<Js::JavascriptString>(pvVar7), !bVar3));
        pJVar6 = VarTo<Js::JavascriptString>(pvVar7);
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_78);
        BVar5 = JavascriptOperators::GetOwnPropertyDescriptor
                          ((RecyclableObject *)(this->wrapper).ptr,pJVar6,this->scriptContext,
                           (PropertyDescriptor *)local_78);
        ptr = JavascriptString::GetString(pJVar6);
        JavascriptString::GetLength(pJVar6);
        Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierSet
                  ((WriteBarrierPtr<const_char16_t> *)&desc.Configurable,ptr);
      } while ((BVar5 == 0) ||
              (bVar3 = JsUtil::
                       BaseHashSet<JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       ::Contains((this->visited).ptr,
                                  (CharacterBuffer<char16_t> *)&desc.Configurable), bVar3));
      JsUtil::
      BaseHashSet<JsUtil::CharacterBuffer<char16_t>,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Add((this->visited).ptr,(CharacterBuffer<char16_t> *)&desc.Configurable);
      bVar3 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_78);
    } while (!bVar3);
    pvVar7 = CrossSite::MarshalVar
                       (this->scriptContext,pJVar6,
                        (((((pJVar6->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr);
    pJVar6 = VarTo<Js::JavascriptString>(pvVar7);
  }
  return pJVar6;
}

Assistant:

virtual JavascriptString * MoveAndGetNext(PropertyId& propertyId, PropertyAttributes* attributes = nullptr) override
        {
            propertyId = Constants::NoProperty;
            if (attributes != nullptr)
            {
                *attributes = PropertyEnumerable;
            }
            // 13.7.5.15 EnumerateObjectProperties(O) (https://tc39.github.io/ecma262/#sec-enumerate-object-properties)
            // for (let key of Reflect.ownKeys(obj)) {
            if (trapResult != nullptr)
            {
                uint32 len = trapResult->GetLength();
                while (index < len)
                {
                    Var var = trapResult->DirectGetItem(index++);
                    if (var)
                    {
                        // if (typeof key === "string") {
                        if (VarIs<JavascriptString>(var))
                        {
                            JavascriptString* propertyName = VarTo<JavascriptString>(var);
                            // let desc = Reflect.getOwnPropertyDescriptor(obj, key);
                            Js::PropertyDescriptor desc;
                            BOOL ret = JavascriptOperators::GetOwnPropertyDescriptor(wrapper, propertyName, scriptContext, &desc);
                            const JsUtil::CharacterBuffer<WCHAR> propertyString(propertyName->GetString(), propertyName->GetLength());
                            // if (desc && !visited.has(key)) {
                            if (ret && !visited->Contains(propertyString))
                            {
                                visited->Add(propertyString);
                                // if (desc.enumerable) yield key;
                                if (desc.IsEnumerable())
                                {
                                    //TODO: (vsadov) not sure if should marshal here, it is "getting"
                                    return VarTo<JavascriptString>(CrossSite::MarshalVar(
                                        scriptContext, propertyName, propertyName->GetScriptContext()));
                                }
                            }
                        }
                    }
                }
            }
            return nullptr;
        }